

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::set_current_tabpage(Nvim *this,Tabpage tabpage)

{
  allocator local_41;
  Tabpage local_40;
  string local_38;
  
  local_40 = tabpage;
  std::__cxx11::string::string((string *)&local_38,"nvim_set_current_tabpage",&local_41);
  NvimRPC::call<long>(&this->client_,&local_38,(nullptr_t)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Nvim::set_current_tabpage(Tabpage tabpage) {
    client_.call("nvim_set_current_tabpage", nullptr, tabpage);
}